

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRelAggregates::~IfcRelAggregates(IfcRelAggregates *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&this->super_IfcRelDecomposes = 0x872b28;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0xd8 = 0x872ba0;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0x88 = 0x872b50;
  (this->super_IfcRelDecomposes).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x872b78;
  pvVar2 = *(void **)&(this->super_IfcRelDecomposes).
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.field_0x18;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&(this->super_IfcRelDecomposes).field_0xc0 - (long)pvVar2);
  }
  *(undefined8 *)&this->super_IfcRelDecomposes = 0x872c40;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0xd8 = 0x872c68;
  puVar3 = *(undefined1 **)&(this->super_IfcRelDecomposes).field_0x60;
  puVar1 = &(this->super_IfcRelDecomposes).field_0x70;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcRelDecomposes).field_0x38;
  puVar1 = &(this->super_IfcRelDecomposes).field_0x48;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcRelDecomposes).field_0x10;
  puVar1 = &(this->super_IfcRelDecomposes).field_0x20;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  operator_delete(this,0xf0);
  return;
}

Assistant:

IfcRelAggregates() : Object("IfcRelAggregates") {}